

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O2

void __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::tighten(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *this)

{
  shared_ptr<soplex::Tolerances> *psVar1;
  type_conflict5 tVar2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar3;
  ulong uVar4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  delta_shift;
  double local_b0;
  undefined1 local_a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_a0;
  uint local_98 [3];
  undefined3 uStack_8b;
  uint uStack_88;
  undefined8 uStack_83;
  undefined8 local_78;
  cpp_dec_float<50U,_int,_void> local_68;
  
  psVar1 = &(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_a8,
             &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  uVar4 = -(ulong)(*(Real *)((long)local_a8 + 0x40) == 1.0);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&local_68,
             (double)(~uVar4 & (ulong)(*(Real *)((long)local_a8 + 0x40) * 1e-05) |
                     uVar4 & 0x3ee4f8b588e368f1),(type *)0x0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_a0);
  pnVar3 = &this->fastDelta;
  local_78._0_4_ = cpp_dec_float_finite;
  local_78._4_4_ = 10;
  local_a8 = (undefined1  [8])0x0;
  _Stack_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_98[0] = 0;
  local_98[1] = 0;
  stack0xffffffffffffff70 = 0;
  uStack_8b = 0;
  _uStack_88 = 0;
  uStack_83 = 0;
  boost::multiprecision::default_ops::
  eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            ((cpp_dec_float<50U,_int,_void> *)local_a8,
             &(this->
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).delta.m_backend,&local_68);
  tVar2 = boost::multiprecision::operator>=
                    (pnVar3,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)local_a8);
  if (tVar2) {
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
              (&pnVar3->m_backend,&local_68);
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_a8,
               &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    uVar4 = -(ulong)(*(Real *)((long)local_a8 + 0x40) == 1.0);
    local_b0 = (double)(~uVar4 & (ulong)(*(Real *)((long)local_a8 + 0x40) * 0.0001) |
                       uVar4 & 0x3f1a36e2eb1c432d);
    tVar2 = boost::multiprecision::operator>(pnVar3,&local_b0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_a0);
    if (tVar2) {
      local_78._0_4_ = cpp_dec_float_finite;
      local_78._4_4_ = 10;
      local_a8 = (undefined1  [8])0x0;
      _Stack_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_98[0] = 0;
      local_98[1] = 0;
      stack0xffffffffffffff70 = 0;
      uStack_8b = 0;
      _uStack_88 = 0;
      uStack_83 = 0;
      local_b0 = 9.88131291682493e-324;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long>
                ((cpp_dec_float<50U,_int,_void> *)local_a8,&local_68,(longlong *)&local_b0);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                (&pnVar3->m_backend,(cpp_dec_float<50U,_int,_void> *)local_a8);
    }
  }
  pnVar3 = &this->minStab;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_a8,
             &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  uVar4 = -(ulong)(*(Real *)((long)local_a8 + 0x40) == 1.0);
  local_b0 = (double)(~uVar4 & (ulong)(*(Real *)((long)local_a8 + 0x40) * 1e-05) |
                     uVar4 & 0x3ee4f8b588e368f1);
  tVar2 = boost::multiprecision::operator<(pnVar3,&local_b0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_a0);
  if (tVar2) {
    local_a8 = (undefined1  [8])0x3feccccccccccccd;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
              (&pnVar3->m_backend,(double *)local_a8);
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_a8,
               &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    local_b0 = Tolerances::floatingPointFeastol((Tolerances *)local_a8);
    tVar2 = boost::multiprecision::operator<(pnVar3,&local_b0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_a0);
    if (tVar2) {
      local_a8 = (undefined1  [8])0x3feccccccccccccd;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
                (&pnVar3->m_backend,(double *)local_a8);
    }
  }
  return;
}

Assistant:

void SPxFastRT<R>::tighten()
{
   R delta_shift = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_DELTA_SHIFT);

   if(fastDelta >= this->delta + delta_shift)
   {
      fastDelta -= delta_shift;

      if(fastDelta > this->tolerances()->scaleAccordingToEpsilon(1e-4))
         fastDelta -= 2 * delta_shift;
   }

   if(minStab < this->tolerances()->scaleAccordingToEpsilon(SOPLEX_MINSTAB))
   {
      minStab /= 0.90;

      if(minStab < this->tolerances()->floatingPointFeastol())
         minStab /= 0.90;
   }
}